

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csr.c
# Opt level: O3

int write_htimedelta(CPURISCVState_conflict2 *env,int csrno,target_ulong val)

{
  if (env->rdtime_fn != (_func_uint64_t *)0x0) {
    env->htimedelta = val;
    return 0;
  }
  return -1;
}

Assistant:

static int write_htimedelta(CPURISCVState *env, int csrno, target_ulong val)
{
    if (!env->rdtime_fn) {
        return -1;
    }

#if defined(TARGET_RISCV32)
    env->htimedelta = deposit64(env->htimedelta, 0, 32, (uint64_t)val);
#else
    env->htimedelta = val;
#endif
    return 0;
}